

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool param_3)

{
  undefined8 *puVar1;
  uint *puVar2;
  long lVar3;
  long *plVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  fpclass_type fVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double *pdVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar17;
  long lVar18;
  long lVar19;
  Real a;
  bool local_4b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  int local_478;
  int local_474;
  cpp_dec_float<50U,_int,_void> local_468;
  cpp_dec_float<50U,_int,_void> local_428;
  uint local_3e8 [6];
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  cpp_dec_float<50U,_int,_void> local_3b8;
  fpclass_type local_378;
  int32_t iStack_374;
  undefined8 uStack_370;
  cpp_dec_float<50U,_int,_void> local_368;
  long local_328;
  long local_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<50U,_int,_void> local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_368.fpclass = cpp_dec_float_finite;
  local_368.prec_elem = 10;
  local_368.data._M_elems[0] = 0;
  local_368.data._M_elems[1] = 0;
  local_368.data._M_elems[2] = 0;
  local_368.data._M_elems[3] = 0;
  local_368.data._M_elems[4] = 0;
  local_368.data._M_elems[5] = 0;
  local_368.data._M_elems[6] = 0;
  local_368.data._M_elems[7] = 0;
  local_368.data._M_elems[8] = 0;
  local_368.data._M_elems[9] = 0;
  local_368.exp = 0;
  local_368.neg = false;
  local_428.fpclass = cpp_dec_float_finite;
  local_428.prec_elem = 10;
  local_428.data._M_elems[0] = 0;
  local_428.data._M_elems[1] = 0;
  local_428.data._M_elems[2] = 0;
  local_428.data._M_elems[3] = 0;
  local_428.data._M_elems[4] = 0;
  local_428.data._M_elems[5] = 0;
  local_428.data._M_elems[6] = 0;
  local_428.data._M_elems[7] = 0;
  local_428.data._M_elems[8] = 0;
  local_428.data._M_elems[9] = 0;
  local_428.exp = 0;
  local_428.neg = false;
  local_468.fpclass = cpp_dec_float_finite;
  local_468.prec_elem = 10;
  local_468.data._M_elems[0] = 0;
  local_468.data._M_elems[1] = 0;
  local_468.data._M_elems[2] = 0;
  local_468.data._M_elems[3] = 0;
  local_468.data._M_elems[4] = 0;
  local_468.data._M_elems[5] = 0;
  local_468.data._M_elems._24_5_ = 0;
  local_468.data._M_elems[7]._1_3_ = 0;
  local_468.data._M_elems._32_5_ = 0;
  local_468.data._M_elems[9]._1_3_ = 0;
  local_468.exp = 0;
  local_468.neg = false;
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems._32_5_ = 0;
  local_2d8.data._M_elems[9]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  local_3e8[4] = 0;
  local_3e8[5] = 0;
  uStack_3d0 = 0;
  local_3e8[0] = 0;
  local_3e8[1] = 0;
  local_3e8[2] = 0;
  local_3e8[3] = 0;
  local_3c8 = 0;
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems[6] = 0;
  local_1e8.data._M_elems[7] = 0;
  local_1e8.data._M_elems._32_5_ = 0;
  local_1e8.data._M_elems[9]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_3b8.fpclass = cpp_dec_float_finite;
  local_3b8.prec_elem = 10;
  local_3b8.data._M_elems[0] = 0;
  local_3b8.data._M_elems[1] = 0;
  local_3b8.data._M_elems[2] = 0;
  local_3b8.data._M_elems[3] = 0;
  local_3b8.data._M_elems[4] = 0;
  local_3b8.data._M_elems[5] = 0;
  local_3b8.data._M_elems._24_5_ = 0;
  local_3b8.data._M_elems[7]._1_3_ = 0;
  local_3b8.data._M_elems._32_5_ = 0;
  local_3b8.data._M_elems[9]._1_3_ = 0;
  local_3b8.exp = 0;
  local_3b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&maxabs.m_backend,1,(type *)0x0);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar12) + 0x1e0));
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems._24_5_ = 0;
  epsilon.m_backend.data._M_elems[7]._1_3_ = 0;
  epsilon.m_backend.data._M_elems._32_5_ = 0;
  epsilon.m_backend.data._M_elems[9]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&epsilon,a);
  degenerateEps(&degeneps,this);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar3 = *(long *)(CONCAT44(extraout_var_00,iVar12) + 0xa48);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar4 = *(long **)(CONCAT44(extraout_var_01,iVar12) + 0xa48);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_320 = CONCAT44(extraout_var_02,iVar12);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_328 = CONCAT44(extraout_var_03,iVar12);
  local_2d8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_2d8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_2d8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_2d8.data._M_elems[6] = (val->m_backend).data._M_elems[6];
  local_2d8.data._M_elems[7] = (val->m_backend).data._M_elems[7];
  uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_2d8.data._M_elems._32_5_ = SUB85(uVar5,0);
  local_2d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_2d8.exp = (val->m_backend).exp;
  local_2d8.neg = (val->m_backend).neg;
  local_2d8.fpclass = (val->m_backend).fpclass;
  local_2d8.prec_elem = (val->m_backend).prec_elem;
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar12) + 0x368))
            (&result_2,(long *)CONCAT44(extraout_var_04,iVar12));
  local_1e8.data._M_elems[6] = result_2.m_backend.data._M_elems[6];
  local_1e8.data._M_elems[7] = result_2.m_backend.data._M_elems[7];
  local_1e8.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
  local_1e8.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
  local_1e8.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
  local_1e8.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
  local_1e8.exp = result_2.m_backend.exp;
  local_1e8.neg = result_2.m_backend.neg;
  local_1e8.fpclass = result_2.m_backend.fpclass;
  local_1e8.prec_elem = result_2.m_backend.prec_elem;
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_05,iVar12) + 0xa48) + 0x50));
  if (((local_2d8.fpclass == cpp_dec_float_NaN) || (epsilon.m_backend.fpclass == cpp_dec_float_NaN))
     || (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_2d8,&epsilon.m_backend), iVar12 < 1)) {
    result_2.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    result_2.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    result_2.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    result_2.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    result_2.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    result_2.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    result_2.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    result_2.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    result_2.m_backend.data._M_elems[7] =
         (uint)(CONCAT35(epsilon.m_backend.data._M_elems[7]._1_3_,
                         epsilon.m_backend.data._M_elems._24_5_) >> 0x20);
    result_2.m_backend.exp = epsilon.m_backend.exp;
    result_2.m_backend.neg = epsilon.m_backend.neg;
    result_2.m_backend.fpclass = epsilon.m_backend.fpclass;
    result_2.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    result_2.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    if (result_2.m_backend.data._M_elems[0] != 0 ||
        epsilon.m_backend.fpclass != cpp_dec_float_finite) {
      result_2.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
    }
    if (epsilon.m_backend.fpclass == cpp_dec_float_NaN) {
      return -1;
    }
    if (local_2d8.fpclass == cpp_dec_float_NaN) {
      return -1;
    }
    result_2.m_backend.data._M_elems._0_16_ = auVar11;
    iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_2d8,&result_2.m_backend);
    if (-1 < iVar12) {
      return -1;
    }
    minDelta(this,&maxabs,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_2d8,*(int *)(lVar3 + 0x58),*(int **)(lVar3 + 0x60),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(lVar3 + 0x70),
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)*plVar4,
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_328 + 0xa28),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_320 + 0xa10));
    if (((local_2d8.fpclass != cpp_dec_float_NaN) && ((val->m_backend).fpclass != cpp_dec_float_NaN)
        ) && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_2d8,&val->m_backend), iVar12 == 0)) {
      return -1;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_368,0);
    ::soplex::infinity::__tls_init();
    pdVar15 = (double *)__tls_get_addr(&PTR_003b6b60);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,*pdVar15);
    auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
    local_3e8[5] = result_2.m_backend.data._M_elems[5];
    local_3e8[4] = result_2.m_backend.data._M_elems[4];
    uStack_3d0 = CONCAT44(result_2.m_backend.data._M_elems[7],result_2.m_backend.data._M_elems[6]);
    local_3e8[0] = result_2.m_backend.data._M_elems[0];
    local_3e8[1] = result_2.m_backend.data._M_elems[1];
    local_3e8[2] = result_2.m_backend.data._M_elems[2];
    local_3e8[3] = result_2.m_backend.data._M_elems[3];
    local_3c8 = CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                         result_2.m_backend.data._M_elems._32_5_);
    local_478 = result_2.m_backend.exp;
    local_4b9 = result_2.m_backend.neg;
    local_378 = result_2.m_backend.fpclass;
    iStack_374 = result_2.m_backend.prec_elem;
    uStack_370 = 0;
    result.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
    result.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = maxabs.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = maxabs.m_backend.data._M_elems[7];
    result.m_backend.data._M_elems[8] = maxabs.m_backend.data._M_elems[8];
    result.m_backend.data._M_elems[9] = maxabs.m_backend.data._M_elems[9];
    result.m_backend.exp = maxabs.m_backend.exp;
    result.m_backend.neg = maxabs.m_backend.neg;
    result.m_backend.fpclass = maxabs.m_backend.fpclass;
    result.m_backend.prec_elem = maxabs.m_backend.prec_elem;
    result_2.m_backend.data._M_elems._0_16_ = auVar11;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result.m_backend,&epsilon.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2.m_backend,0.001);
    result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    result_1.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    result_1.m_backend.exp = result.m_backend.exp;
    result_1.m_backend.neg = result.m_backend.neg;
    result_1.m_backend.fpclass = result.m_backend.fpclass;
    result_1.m_backend.prec_elem = result.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_1.m_backend,&result_2.m_backend);
    local_3b8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    local_3b8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    local_3b8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    local_3b8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    local_3b8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    local_3b8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    local_3b8.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
    local_3b8.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
    local_3b8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    local_3b8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    local_3b8.exp = result_1.m_backend.exp;
    local_3b8.neg = result_1.m_backend.neg;
    local_3b8.fpclass = result_1.m_backend.fpclass;
    local_3b8.prec_elem = result_1.m_backend.prec_elem;
    if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
        (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_3b8,&epsilon.m_backend), iVar12 < 0)) {
      local_3b8.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
      local_3b8.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
      local_3b8.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
      local_3b8.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
      local_3b8.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
      local_3b8.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
      local_3b8.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      local_3b8.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
      local_3b8.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
      local_3b8.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
      local_3b8.exp = epsilon.m_backend.exp;
      local_3b8.neg = epsilon.m_backend.neg;
      local_3b8.fpclass = epsilon.m_backend.fpclass;
      local_3b8.prec_elem = epsilon.m_backend.prec_elem;
    }
    if (0 < (long)*(int *)(lVar3 + 0x58)) {
      lVar18 = (long)*(int *)(lVar3 + 0x58) + 1;
      local_474 = -1;
      do {
        lVar6 = *(long *)(lVar3 + 0x70);
        iVar12 = *(int *)(*(long *)(lVar3 + 0x60) + -8 + lVar18 * 4);
        lVar19 = (long)iVar12 * 0x38;
        local_428.exp = *(int *)(lVar6 + 0x28 + lVar19);
        local_428.neg = *(bool *)(lVar6 + 0x2c + lVar19);
        local_428._48_8_ = *(undefined8 *)(lVar6 + 0x30 + lVar19);
        uVar7 = *(undefined8 *)(lVar6 + lVar19);
        uVar8 = ((undefined8 *)(lVar6 + lVar19))[1];
        puVar1 = (undefined8 *)(lVar6 + 0x10 + lVar19);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        uVar5 = *(undefined8 *)(lVar6 + 0x20 + lVar19);
        local_428.data._M_elems[8] = (uint)uVar5;
        local_428.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        local_428.data._M_elems[4] = (uint)uVar9;
        local_428.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
        local_428.data._M_elems[6] = (uint)uVar10;
        local_428.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
        local_428.data._M_elems[0] = (uint)uVar7;
        local_428.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
        local_428.data._M_elems[2] = (uint)uVar8;
        local_428.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
        result_2.m_backend.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
        result_2.m_backend.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
        result_2.m_backend.data._M_elems[4] = local_3b8.data._M_elems[4];
        result_2.m_backend.data._M_elems[5] = local_3b8.data._M_elems[5];
        result_2.m_backend.data._M_elems[6] = local_3b8.data._M_elems[6];
        result_2.m_backend.data._M_elems[7] =
             (uint)(CONCAT35(local_3b8.data._M_elems[7]._1_3_,local_3b8.data._M_elems._24_5_) >>
                   0x20);
        result_2.m_backend.data._M_elems[2] = local_3b8.data._M_elems[2];
        result_2.m_backend.data._M_elems[3] = local_3b8.data._M_elems[3];
        result_2.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
        result_2.m_backend.data._M_elems[1] = local_3b8.data._M_elems[1];
        auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
        result_2.m_backend.exp = local_3b8.exp;
        result_2.m_backend.neg = local_3b8.neg;
        result_2.m_backend.fpclass = local_3b8.fpclass;
        result_2.m_backend.prec_elem = local_3b8.prec_elem;
        result_2.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
        if (result_2.m_backend.data._M_elems[0] != 0 || local_3b8.fpclass != cpp_dec_float_finite) {
          result_2.m_backend.neg = (bool)(local_3b8.neg ^ 1);
        }
        result_2.m_backend.data._M_elems._0_16_ = auVar11;
        if ((local_3b8.fpclass == cpp_dec_float_NaN || local_428.fpclass == cpp_dec_float_NaN) ||
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_428,&result_2.m_backend), -1 < iVar13)) {
          if ((local_428.fpclass == cpp_dec_float_NaN) ||
             ((local_3b8.fpclass == cpp_dec_float_NaN ||
              (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_428,&local_3b8), iVar13 < 1)))) {
            lVar6 = *(long *)(lVar3 + 0x60);
            lVar19 = *(long *)(lVar3 + 0x70);
            lVar17 = (long)*(int *)(lVar6 + -8 + lVar18 * 4) * 0x38;
            *(undefined8 *)(lVar19 + 0x30 + lVar17) = 0xa00000000;
            *(undefined1 (*) [16])(lVar19 + lVar17) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(lVar19 + 0x10 + lVar17) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(lVar19 + 0x1d + lVar17) = (undefined1  [16])0x0;
            iVar12 = *(int *)(lVar3 + 0x58);
            *(int *)(lVar3 + 0x58) = iVar12 + -1;
            *(undefined4 *)(lVar6 + -8 + lVar18 * 4) =
                 *(undefined4 *)(lVar6 + -4 + (long)iVar12 * 4);
            uVar5 = result_1.m_backend._48_8_;
          }
          else {
            pcVar16 = (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_328 + 0xa28) + lVar19);
            result_2.m_backend.fpclass = cpp_dec_float_finite;
            result_2.m_backend.prec_elem = 10;
            result_2.m_backend.data._M_elems[0] = 0;
            result_2.m_backend.data._M_elems[1] = 0;
            result_2.m_backend.data._M_elems[2] = 0;
            result_2.m_backend.data._M_elems[3] = 0;
            result_2.m_backend.data._M_elems[4] = 0;
            result_2.m_backend.data._M_elems[5] = 0;
            result_2.m_backend.data._M_elems[6] = 0;
            result_2.m_backend.data._M_elems[7] = 0;
            result_2.m_backend.data._M_elems._32_5_ = 0;
            result_2.m_backend.data._M_elems[9]._1_3_ = 0;
            result_2.m_backend.exp = 0;
            result_2.m_backend.neg = false;
            if (&result_2.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_2.m_backend,pcVar16);
              if (result_2.m_backend.data._M_elems[0] != 0 ||
                  result_2.m_backend.fpclass != cpp_dec_float_finite) {
                result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_2.m_backend != pcVar16) {
                uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
                result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
                result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                result_2.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pcVar16->data)._M_elems;
                uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
                uVar7 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
                result_2.m_backend.data._M_elems[4] = (uint)uVar5;
                result_2.m_backend.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
                result_2.m_backend.data._M_elems[6] = (uint)uVar7;
                result_2.m_backend.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
                result_2.m_backend.exp = pcVar16->exp;
                result_2.m_backend.neg = pcVar16->neg;
                result_2.m_backend.fpclass = pcVar16->fpclass;
                result_2.m_backend.prec_elem = pcVar16->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19));
            }
            auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
            local_468.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
            local_468.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
            local_468.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
            local_468.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
            local_468.data._M_elems._24_5_ =
                 SUB85(CONCAT44(result_2.m_backend.data._M_elems[7],
                                result_2.m_backend.data._M_elems[6]),0);
            local_468.data._M_elems[7]._1_3_ =
                 (undefined3)(result_2.m_backend.data._M_elems[7] >> 8);
            local_468.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
            local_468.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
            local_468.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
            local_468.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
            local_468.exp = result_2.m_backend.exp;
            local_468.neg = result_2.m_backend.neg;
            local_468.fpclass = result_2.m_backend.fpclass;
            local_468.prec_elem = result_2.m_backend.prec_elem;
            result_2.m_backend.data._M_elems._0_16_ = auVar11;
            if (((result_2.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_468,&degeneps.m_backend), iVar13 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                        (&local_468,&local_428);
              uVar5 = result_1.m_backend._48_8_;
              if (((local_468.fpclass != cpp_dec_float_NaN) &&
                  (local_2d8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_468,&local_2d8), uVar5 = result_1.m_backend._48_8_,
                 -1 < iVar13)) {
                result_2.m_backend.data._M_elems._32_5_ = SUB85(local_3c8,0);
                result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_3c8 >> 0x28);
                result_2.m_backend.data._M_elems[4] = (uint)local_3e8._16_8_;
                result_2.m_backend.data._M_elems[5] = SUB84(local_3e8._16_8_,4);
                result_2.m_backend.data._M_elems[6] = (uint)uStack_3d0;
                result_2.m_backend.data._M_elems[7] = (uint)((ulong)uStack_3d0 >> 0x20);
                result_2.m_backend.data._M_elems[2] = local_3e8[2];
                result_2.m_backend.data._M_elems[3] = local_3e8[3];
                result_2.m_backend.data._M_elems[0] = local_3e8[0];
                result_2.m_backend.data._M_elems[1] = local_3e8[1];
                result_2.m_backend.exp = local_478;
                result_2.m_backend.neg = local_4b9;
                result_2.m_backend.fpclass = local_378;
                result_2.m_backend.prec_elem = iStack_374;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&result_2.m_backend,&epsilon.m_backend);
                uVar5 = result_1.m_backend._48_8_;
                if (((local_468.fpclass != cpp_dec_float_NaN) &&
                    (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                   ((iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_468,&result_2.m_backend),
                    uVar5 = result_1.m_backend._48_8_, iVar13 < 0 &&
                    (((local_428.fpclass != cpp_dec_float_NaN &&
                      (local_368.fpclass != cpp_dec_float_NaN)) &&
                     (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_428,&local_368), uVar5 = result_1.m_backend._48_8_,
                     0 < iVar13)))))) {
                  local_3c8 = CONCAT35(local_468.data._M_elems[9]._1_3_,
                                       local_468.data._M_elems._32_5_);
                  uStack_3d0 = CONCAT35(local_468.data._M_elems[7]._1_3_,
                                        local_468.data._M_elems._24_5_);
                  local_368.neg = local_428.neg;
                  goto LAB_002cedbd;
                }
              }
            }
            else {
              iVar13 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])(this);
              lVar6 = *plVar4;
              local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar6 + lVar19);
              local_1a8.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar6 + lVar19) + 2);
              puVar2 = (uint *)(lVar6 + 0x10 + lVar19);
              local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar19);
              local_1a8.m_backend.exp = *(int *)(lVar6 + 0x28 + lVar19);
              local_1a8.m_backend.neg = *(bool *)(lVar6 + 0x2c + lVar19);
              local_1a8.m_backend._48_8_ = *(undefined8 *)(lVar6 + 0x30 + lVar19);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_08,iVar13),iVar12,&local_1a8);
              uVar5 = result_1.m_backend._48_8_;
            }
          }
        }
        else {
          pcVar16 = (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_320 + 0xa10) + lVar19);
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 10;
          result_2.m_backend.data._M_elems[0] = 0;
          result_2.m_backend.data._M_elems[1] = 0;
          result_2.m_backend.data._M_elems[2] = 0;
          result_2.m_backend.data._M_elems[3] = 0;
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems[6] = 0;
          result_2.m_backend.data._M_elems[7] = 0;
          result_2.m_backend.data._M_elems._32_5_ = 0;
          result_2.m_backend.data._M_elems[9]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          if (&result_2.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_2.m_backend,pcVar16);
            if (result_2.m_backend.data._M_elems[0] != 0 ||
                result_2.m_backend.fpclass != cpp_dec_float_finite) {
              result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
            }
          }
          else {
            if (&result_2.m_backend != pcVar16) {
              uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
              result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
              result_2.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])(pcVar16->data)._M_elems;
              uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
              uVar7 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
              result_2.m_backend.data._M_elems[4] = (uint)uVar5;
              result_2.m_backend.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
              result_2.m_backend.data._M_elems[6] = (uint)uVar7;
              result_2.m_backend.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
              result_2.m_backend.exp = pcVar16->exp;
              result_2.m_backend.neg = pcVar16->neg;
              result_2.m_backend.fpclass = pcVar16->fpclass;
              result_2.m_backend.prec_elem = pcVar16->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19));
          }
          local_468.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
          local_468.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
          local_468.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
          local_468.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
          local_468.data._M_elems._24_5_ =
               SUB85(CONCAT44(result_2.m_backend.data._M_elems[7],
                              result_2.m_backend.data._M_elems[6]),0);
          local_468.data._M_elems[7]._1_3_ = (undefined3)(result_2.m_backend.data._M_elems[7] >> 8);
          local_468.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
          local_468.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
          local_468.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
          local_468.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
          local_468.exp = result_2.m_backend.exp;
          local_468.neg = result_2.m_backend.neg;
          local_468.fpclass = result_2.m_backend.fpclass;
          local_468.prec_elem = result_2.m_backend.prec_elem;
          result_2.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
          result_2.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
          result_2.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
          result_2.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
          result_2.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
          result_2.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
          result_2.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
          result_2.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
          result_2.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
          result_2.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
          auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
          result_2.m_backend.exp = degeneps.m_backend.exp;
          result_2.m_backend.neg = degeneps.m_backend.neg;
          uVar7._4_4_ = degeneps.m_backend.prec_elem;
          uVar7._0_4_ = degeneps.m_backend.fpclass;
          result_2.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
          if (result_2.m_backend.data._M_elems[0] != 0 ||
              degeneps.m_backend.fpclass != cpp_dec_float_finite) {
            result_2.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
          }
          fVar14 = result_2.m_backend.fpclass;
          result_2.m_backend.data._M_elems._0_16_ = auVar11;
          result_2.m_backend._48_8_ = uVar7;
          if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar14 == cpp_dec_float_NaN) ||
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_468,&result_2.m_backend), -1 < iVar13)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                      (&local_468,&local_428);
            uVar5 = result_1.m_backend._48_8_;
            if ((local_468.fpclass != cpp_dec_float_NaN) &&
               ((local_2d8.fpclass != cpp_dec_float_NaN &&
                (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_468,&local_2d8), uVar5 = result_1.m_backend._48_8_,
                -1 < iVar13)))) {
              result_2.m_backend.data._M_elems._32_5_ = SUB85(local_3c8,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_3c8 >> 0x28);
              result_2.m_backend.data._M_elems[4] = (uint)local_3e8._16_8_;
              result_2.m_backend.data._M_elems[5] = SUB84(local_3e8._16_8_,4);
              result_2.m_backend.data._M_elems[6] = (uint)uStack_3d0;
              result_2.m_backend.data._M_elems[7] = (uint)((ulong)uStack_3d0 >> 0x20);
              result_2.m_backend.data._M_elems[2] = local_3e8[2];
              result_2.m_backend.data._M_elems[3] = local_3e8[3];
              result_2.m_backend.data._M_elems[0] = local_3e8[0];
              result_2.m_backend.data._M_elems[1] = local_3e8[1];
              result_2.m_backend.exp = local_478;
              result_2.m_backend.neg = local_4b9;
              result_2.m_backend.fpclass = local_378;
              result_2.m_backend.prec_elem = iStack_374;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&result_2.m_backend,&epsilon.m_backend);
              uVar5 = result_1.m_backend._48_8_;
              if ((local_468.fpclass != cpp_dec_float_NaN) &&
                 ((result_2.m_backend.fpclass != cpp_dec_float_NaN &&
                  (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_468,&result_2.m_backend),
                  uVar5 = result_1.m_backend._48_8_, iVar13 < 0)))) {
                result_1.m_backend.data._M_elems[1] = local_428.data._M_elems[1];
                result_1.m_backend.data._M_elems[0] = local_428.data._M_elems[0];
                result_1.m_backend.data._M_elems[3] = local_428.data._M_elems[3];
                result_1.m_backend.data._M_elems[2] = local_428.data._M_elems[2];
                result_1.m_backend.data._M_elems[5] = local_428.data._M_elems[5];
                result_1.m_backend.data._M_elems[4] = local_428.data._M_elems[4];
                result_1.m_backend.data._M_elems._32_5_ =
                     SUB85(CONCAT44(local_428.data._M_elems[9],local_428.data._M_elems[8]),0);
                result_1.m_backend.data._M_elems[9]._1_3_ =
                     (undefined3)(local_428.data._M_elems[9] >> 8);
                result_1.m_backend.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_428.data._M_elems[7],local_428.data._M_elems[6]),0);
                result_1.m_backend.data._M_elems[7]._1_3_ =
                     (undefined3)(local_428.data._M_elems[7] >> 8);
                result_1.m_backend.exp = local_428.exp;
                result_1.m_backend.neg = local_428.neg;
                uVar5._0_4_ = local_428.fpclass;
                uVar5._4_4_ = local_428.prec_elem;
                result_1.m_backend.fpclass = local_428.fpclass;
                result_1.m_backend.prec_elem = local_428.prec_elem;
                if (local_428.data._M_elems[0] != 0 || local_428.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(local_428.neg ^ 1);
                }
                if (((local_428.fpclass != cpp_dec_float_NaN) &&
                    (uVar5 = result_1.m_backend._48_8_, local_368.fpclass != cpp_dec_float_NaN)) &&
                   (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&result_1.m_backend,&local_368),
                   uVar5 = result_1.m_backend._48_8_, 0 < iVar13)) {
                  local_3c8 = CONCAT35(local_468.data._M_elems[9]._1_3_,
                                       local_468.data._M_elems._32_5_);
                  uStack_3d0 = CONCAT35(local_468.data._M_elems[7]._1_3_,
                                        local_468.data._M_elems._24_5_);
                  local_368.neg =
                       (bool)((local_428.data._M_elems[0] != 0 ||
                              local_428.fpclass != cpp_dec_float_finite) ^ local_428.neg);
LAB_002cedbd:
                  uStack_370 = 0;
                  local_4b9 = local_468.neg;
                  local_478 = local_468.exp;
                  local_474 = iVar12;
                  local_3e8._0_8_ = local_468.data._M_elems._0_8_;
                  local_3e8._8_8_ = local_468.data._M_elems._8_8_;
                  local_3e8._16_8_ = local_468.data._M_elems._16_8_;
                  _local_378 = local_468._48_8_;
                  local_368.data._M_elems[0] = local_428.data._M_elems[0];
                  local_368.data._M_elems[1] = local_428.data._M_elems[1];
                  local_368.data._M_elems[2] = local_428.data._M_elems[2];
                  local_368.data._M_elems[3] = local_428.data._M_elems[3];
                  local_368.data._M_elems[4] = local_428.data._M_elems[4];
                  local_368.data._M_elems[5] = local_428.data._M_elems[5];
                  local_368.data._M_elems[6] = local_428.data._M_elems[6];
                  local_368.data._M_elems[7] = local_428.data._M_elems[7];
                  local_368.data._M_elems[8] = local_428.data._M_elems[8];
                  local_368.data._M_elems[9] = local_428.data._M_elems[9];
                  local_368.exp = local_428.exp;
                  local_368._48_8_ = local_428._48_8_;
                  uVar5 = result_1.m_backend._48_8_;
                }
              }
            }
          }
          else {
            iVar13 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])(this);
            lVar6 = *plVar4;
            local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar6 + lVar19);
            local_168.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar6 + lVar19) + 2);
            puVar2 = (uint *)(lVar6 + 0x10 + lVar19);
            local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar19);
            local_168.m_backend.exp = *(int *)(lVar6 + 0x28 + lVar19);
            local_168.m_backend.neg = *(bool *)(lVar6 + 0x2c + lVar19);
            local_168.m_backend._48_8_ = *(undefined8 *)(lVar6 + 0x30 + lVar19);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftUBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_09,iVar13),iVar12,&local_168);
            uVar5 = result_1.m_backend._48_8_;
          }
        }
        result_1.m_backend._48_8_ = uVar5;
        lVar18 = lVar18 + -1;
      } while (1 < lVar18);
      goto LAB_002cee51;
    }
  }
  else {
    maxDelta(this,&maxabs,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_2d8,*(int *)(lVar3 + 0x58),*(int **)(lVar3 + 0x60),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(lVar3 + 0x70),
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)*plVar4,
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_328 + 0xa28),
             *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               **)(local_320 + 0xa10));
    if (((local_2d8.fpclass != cpp_dec_float_NaN) && ((val->m_backend).fpclass != cpp_dec_float_NaN)
        ) && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_2d8,&val->m_backend), iVar12 == 0)) {
      return -1;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_368,0);
    ::soplex::infinity::__tls_init();
    pdVar15 = (double *)__tls_get_addr(&PTR_003b6b60);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2,-*pdVar15);
    auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
    local_3e8[5] = result_2.m_backend.data._M_elems[5];
    local_3e8[4] = result_2.m_backend.data._M_elems[4];
    uStack_3d0 = CONCAT44(result_2.m_backend.data._M_elems[7],result_2.m_backend.data._M_elems[6]);
    local_3e8[0] = result_2.m_backend.data._M_elems[0];
    local_3e8[1] = result_2.m_backend.data._M_elems[1];
    local_3e8[2] = result_2.m_backend.data._M_elems[2];
    local_3e8[3] = result_2.m_backend.data._M_elems[3];
    local_3c8 = CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                         result_2.m_backend.data._M_elems._32_5_);
    local_478 = result_2.m_backend.exp;
    local_4b9 = result_2.m_backend.neg;
    local_378 = result_2.m_backend.fpclass;
    iStack_374 = result_2.m_backend.prec_elem;
    uStack_370 = 0;
    result.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
    result.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems[6] = maxabs.m_backend.data._M_elems[6];
    result.m_backend.data._M_elems[7] = maxabs.m_backend.data._M_elems[7];
    result.m_backend.data._M_elems[8] = maxabs.m_backend.data._M_elems[8];
    result.m_backend.data._M_elems[9] = maxabs.m_backend.data._M_elems[9];
    result.m_backend.exp = maxabs.m_backend.exp;
    result.m_backend.neg = maxabs.m_backend.neg;
    result.m_backend.fpclass = maxabs.m_backend.fpclass;
    result.m_backend.prec_elem = maxabs.m_backend.prec_elem;
    result_2.m_backend.data._M_elems._0_16_ = auVar11;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result.m_backend,&epsilon.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_2.m_backend,0.001);
    result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
    result_1.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
    result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
    result_1.m_backend.exp = result.m_backend.exp;
    result_1.m_backend.neg = result.m_backend.neg;
    result_1.m_backend.fpclass = result.m_backend.fpclass;
    result_1.m_backend.prec_elem = result.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_1.m_backend,&result_2.m_backend);
    local_3b8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    local_3b8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    local_3b8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    local_3b8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    local_3b8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    local_3b8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    local_3b8.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
    local_3b8.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
    local_3b8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    local_3b8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    local_3b8.exp = result_1.m_backend.exp;
    local_3b8.neg = result_1.m_backend.neg;
    local_3b8.fpclass = result_1.m_backend.fpclass;
    local_3b8.prec_elem = result_1.m_backend.prec_elem;
    if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
        (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_3b8,&epsilon.m_backend), iVar12 < 0)) {
      local_3b8.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
      local_3b8.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
      local_3b8.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
      local_3b8.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
      local_3b8.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
      local_3b8.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
      local_3b8.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
      local_3b8.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
      local_3b8.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
      local_3b8.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
      local_3b8.exp = epsilon.m_backend.exp;
      local_3b8.neg = epsilon.m_backend.neg;
      local_3b8.fpclass = epsilon.m_backend.fpclass;
      local_3b8.prec_elem = epsilon.m_backend.prec_elem;
    }
    if (0 < (long)*(int *)(lVar3 + 0x58)) {
      lVar18 = (long)*(int *)(lVar3 + 0x58) + 1;
      local_474 = -1;
      do {
        lVar6 = *(long *)(lVar3 + 0x70);
        iVar12 = *(int *)(*(long *)(lVar3 + 0x60) + -8 + lVar18 * 4);
        lVar19 = (long)iVar12 * 0x38;
        local_428.exp = *(int *)(lVar6 + 0x28 + lVar19);
        local_428.neg = *(bool *)(lVar6 + 0x2c + lVar19);
        local_428._48_8_ = *(undefined8 *)(lVar6 + 0x30 + lVar19);
        uVar7 = *(undefined8 *)(lVar6 + lVar19);
        uVar8 = ((undefined8 *)(lVar6 + lVar19))[1];
        puVar1 = (undefined8 *)(lVar6 + 0x10 + lVar19);
        uVar9 = *puVar1;
        uVar10 = puVar1[1];
        uVar5 = *(undefined8 *)(lVar6 + 0x20 + lVar19);
        local_428.data._M_elems[8] = (uint)uVar5;
        local_428.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        local_428.data._M_elems[4] = (uint)uVar9;
        local_428.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
        local_428.data._M_elems[6] = (uint)uVar10;
        local_428.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
        local_428.data._M_elems[0] = (uint)uVar7;
        local_428.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
        local_428.data._M_elems[2] = (uint)uVar8;
        local_428.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
        if (((local_428.fpclass == cpp_dec_float_NaN) || (local_3b8.fpclass == cpp_dec_float_NaN))
           || (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_428,&local_3b8), iVar13 < 1)) {
          result_2.m_backend.data._M_elems[2] = local_3b8.data._M_elems[2];
          result_2.m_backend.data._M_elems[3] = local_3b8.data._M_elems[3];
          result_2.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
          result_2.m_backend.data._M_elems[1] = local_3b8.data._M_elems[1];
          auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
          result_2.m_backend.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
          result_2.m_backend.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
          result_2.m_backend.data._M_elems[4] = local_3b8.data._M_elems[4];
          result_2.m_backend.data._M_elems[5] = local_3b8.data._M_elems[5];
          result_2.m_backend.data._M_elems[6] = local_3b8.data._M_elems[6];
          result_2.m_backend.data._M_elems[7] =
               (uint)(CONCAT35(local_3b8.data._M_elems[7]._1_3_,local_3b8.data._M_elems._24_5_) >>
                     0x20);
          result_2.m_backend.exp = local_3b8.exp;
          result_2.m_backend.neg = local_3b8.neg;
          result_2.m_backend.fpclass = local_3b8.fpclass;
          result_2.m_backend.prec_elem = local_3b8.prec_elem;
          result_2.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
          if (result_2.m_backend.data._M_elems[0] != 0 || local_3b8.fpclass != cpp_dec_float_finite)
          {
            result_2.m_backend.neg = (bool)(local_3b8.neg ^ 1);
          }
          result_2.m_backend.data._M_elems._0_16_ = auVar11;
          if (((local_3b8.fpclass == cpp_dec_float_NaN) || (local_428.fpclass == cpp_dec_float_NaN))
             || (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_428,&result_2.m_backend), -1 < iVar13)) {
            lVar6 = *(long *)(lVar3 + 0x60);
            lVar19 = *(long *)(lVar3 + 0x70);
            lVar17 = (long)*(int *)(lVar6 + -8 + lVar18 * 4) * 0x38;
            *(undefined8 *)(lVar19 + 0x30 + lVar17) = 0xa00000000;
            *(undefined1 (*) [16])(lVar19 + lVar17) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(lVar19 + 0x10 + lVar17) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(lVar19 + 0x1d + lVar17) = (undefined1  [16])0x0;
            iVar12 = *(int *)(lVar3 + 0x58);
            *(int *)(lVar3 + 0x58) = iVar12 + -1;
            *(undefined4 *)(lVar6 + -8 + lVar18 * 4) =
                 *(undefined4 *)(lVar6 + -4 + (long)iVar12 * 4);
            uVar8 = result_1.m_backend._48_8_;
          }
          else {
            pcVar16 = (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_328 + 0xa28) + lVar19);
            result_2.m_backend.fpclass = cpp_dec_float_finite;
            result_2.m_backend.prec_elem = 10;
            result_2.m_backend.data._M_elems[0] = 0;
            result_2.m_backend.data._M_elems[1] = 0;
            result_2.m_backend.data._M_elems[2] = 0;
            result_2.m_backend.data._M_elems[3] = 0;
            result_2.m_backend.data._M_elems[4] = 0;
            result_2.m_backend.data._M_elems[5] = 0;
            result_2.m_backend.data._M_elems[6] = 0;
            result_2.m_backend.data._M_elems[7] = 0;
            result_2.m_backend.data._M_elems._32_5_ = 0;
            result_2.m_backend.data._M_elems[9]._1_3_ = 0;
            result_2.m_backend.exp = 0;
            result_2.m_backend.neg = false;
            if (&result_2.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_2.m_backend,pcVar16);
              if (result_2.m_backend.data._M_elems[0] != 0 ||
                  result_2.m_backend.fpclass != cpp_dec_float_finite) {
                result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_2.m_backend != pcVar16) {
                uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
                result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
                result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                result_2.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pcVar16->data)._M_elems;
                uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
                uVar7 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
                result_2.m_backend.data._M_elems[4] = (uint)uVar5;
                result_2.m_backend.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
                result_2.m_backend.data._M_elems[6] = (uint)uVar7;
                result_2.m_backend.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
                result_2.m_backend.exp = pcVar16->exp;
                result_2.m_backend.neg = pcVar16->neg;
                result_2.m_backend.fpclass = pcVar16->fpclass;
                result_2.m_backend.prec_elem = pcVar16->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19));
            }
            auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
            local_468.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
            local_468.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
            local_468.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
            local_468.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
            local_468.data._M_elems._24_5_ =
                 SUB85(CONCAT44(result_2.m_backend.data._M_elems[7],
                                result_2.m_backend.data._M_elems[6]),0);
            local_468.data._M_elems[7]._1_3_ =
                 (undefined3)(result_2.m_backend.data._M_elems[7] >> 8);
            local_468.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
            local_468.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
            local_468.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
            local_468.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
            local_468.exp = result_2.m_backend.exp;
            local_468.neg = result_2.m_backend.neg;
            local_468.fpclass = result_2.m_backend.fpclass;
            local_468.prec_elem = result_2.m_backend.prec_elem;
            result_2.m_backend.data._M_elems._0_16_ = auVar11;
            if (((result_2.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_468,&degeneps.m_backend), iVar13 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                        (&local_468,&local_428);
              uVar8 = result_1.m_backend._48_8_;
              if (((local_468.fpclass != cpp_dec_float_NaN) &&
                  (local_2d8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_468,&local_2d8), uVar8 = result_1.m_backend._48_8_,
                 iVar13 < 1)) {
                result_2.m_backend.data._M_elems._32_5_ = SUB85(local_3c8,0);
                result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_3c8 >> 0x28);
                result_2.m_backend.data._M_elems[4] = (uint)local_3e8._16_8_;
                result_2.m_backend.data._M_elems[5] = SUB84(local_3e8._16_8_,4);
                result_2.m_backend.data._M_elems[6] = (uint)uStack_3d0;
                result_2.m_backend.data._M_elems[7] = (uint)((ulong)uStack_3d0 >> 0x20);
                result_2.m_backend.data._M_elems[2] = local_3e8[2];
                result_2.m_backend.data._M_elems[3] = local_3e8[3];
                result_2.m_backend.data._M_elems[0] = local_3e8[0];
                result_2.m_backend.data._M_elems[1] = local_3e8[1];
                result_2.m_backend.exp = local_478;
                result_2.m_backend.neg = local_4b9;
                result_2.m_backend.fpclass = local_378;
                result_2.m_backend.prec_elem = iStack_374;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_2.m_backend,&epsilon.m_backend);
                uVar8 = result_1.m_backend._48_8_;
                if (((local_468.fpclass != cpp_dec_float_NaN) &&
                    (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
                   (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_468,&result_2.m_backend),
                   uVar8 = result_1.m_backend._48_8_, 0 < iVar13)) {
                  result_1.m_backend.data._M_elems[1] = local_428.data._M_elems[1];
                  result_1.m_backend.data._M_elems[0] = local_428.data._M_elems[0];
                  result_1.m_backend.data._M_elems[3] = local_428.data._M_elems[3];
                  result_1.m_backend.data._M_elems[2] = local_428.data._M_elems[2];
                  result_1.m_backend.data._M_elems[5] = local_428.data._M_elems[5];
                  result_1.m_backend.data._M_elems[4] = local_428.data._M_elems[4];
                  result_1.m_backend.data._M_elems._32_5_ =
                       SUB85(CONCAT44(local_428.data._M_elems[9],local_428.data._M_elems[8]),0);
                  result_1.m_backend.data._M_elems[9]._1_3_ =
                       (undefined3)(local_428.data._M_elems[9] >> 8);
                  result_1.m_backend.data._M_elems._24_5_ =
                       SUB85(CONCAT44(local_428.data._M_elems[7],local_428.data._M_elems[6]),0);
                  result_1.m_backend.data._M_elems[7]._1_3_ =
                       (undefined3)(local_428.data._M_elems[7] >> 8);
                  result_1.m_backend.exp = local_428.exp;
                  result_1.m_backend.neg = local_428.neg;
                  uVar8._0_4_ = local_428.fpclass;
                  uVar8._4_4_ = local_428.prec_elem;
                  result_1.m_backend.fpclass = local_428.fpclass;
                  result_1.m_backend.prec_elem = local_428.prec_elem;
                  if (local_428.data._M_elems[0] != 0 || local_428.fpclass != cpp_dec_float_finite)
                  {
                    result_1.m_backend.neg = (bool)(local_428.neg ^ 1);
                  }
                  if (((local_428.fpclass != cpp_dec_float_NaN) &&
                      (uVar8 = result_1.m_backend._48_8_, local_368.fpclass != cpp_dec_float_NaN))
                     && (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&result_1.m_backend,&local_368),
                        uVar8 = result_1.m_backend._48_8_, 0 < iVar13)) {
                    local_3c8 = CONCAT35(local_468.data._M_elems[9]._1_3_,
                                         local_468.data._M_elems._32_5_);
                    uStack_3d0 = CONCAT35(local_468.data._M_elems[7]._1_3_,
                                          local_468.data._M_elems._24_5_);
                    local_368.neg =
                         (bool)((local_428.data._M_elems[0] != 0 ||
                                local_428.fpclass != cpp_dec_float_finite) ^ local_428.neg);
                    goto LAB_002ce178;
                  }
                }
              }
            }
            else {
              iVar13 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])(this);
              lVar6 = *plVar4;
              local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar6 + lVar19);
              local_128.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar6 + lVar19) + 2);
              puVar2 = (uint *)(lVar6 + 0x10 + lVar19);
              local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar19);
              local_128.m_backend.exp = *(int *)(lVar6 + 0x28 + lVar19);
              local_128.m_backend.neg = *(bool *)(lVar6 + 0x2c + lVar19);
              local_128.m_backend._48_8_ = *(undefined8 *)(lVar6 + 0x30 + lVar19);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_07,iVar13),iVar12,&local_128);
              uVar8 = result_1.m_backend._48_8_;
            }
          }
        }
        else {
          pcVar16 = (cpp_dec_float<50U,_int,_void> *)(*(long *)(local_320 + 0xa10) + lVar19);
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 10;
          result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems[6] = 0;
          result_2.m_backend.data._M_elems[7] = 0;
          result_2.m_backend.data._M_elems._32_5_ = 0;
          result_2.m_backend.data._M_elems[9]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          if (&result_2.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_2.m_backend,pcVar16);
            if (result_2.m_backend.data._M_elems[0] != 0 ||
                result_2.m_backend.fpclass != cpp_dec_float_finite) {
              result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
            }
          }
          else {
            if (&result_2.m_backend != pcVar16) {
              uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
              result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
              result_2.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])(pcVar16->data)._M_elems;
              uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
              uVar7 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
              result_2.m_backend.data._M_elems[4] = (uint)uVar5;
              result_2.m_backend.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
              result_2.m_backend.data._M_elems[6] = (uint)uVar7;
              result_2.m_backend.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
              result_2.m_backend.exp = pcVar16->exp;
              result_2.m_backend.neg = pcVar16->neg;
              result_2.m_backend.fpclass = pcVar16->fpclass;
              result_2.m_backend.prec_elem = pcVar16->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar4 + lVar19));
          }
          local_468.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
          local_468.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
          local_468.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
          local_468.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
          local_468.data._M_elems._24_5_ =
               SUB85(CONCAT44(result_2.m_backend.data._M_elems[7],
                              result_2.m_backend.data._M_elems[6]),0);
          local_468.data._M_elems[7]._1_3_ = (undefined3)(result_2.m_backend.data._M_elems[7] >> 8);
          local_468.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
          local_468.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
          local_468.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
          local_468.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
          local_468.exp = result_2.m_backend.exp;
          local_468.neg = result_2.m_backend.neg;
          local_468.fpclass = result_2.m_backend.fpclass;
          local_468.prec_elem = result_2.m_backend.prec_elem;
          result_2.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
          result_2.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
          result_2.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
          result_2.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
          result_2.m_backend.data._M_elems[6] = degeneps.m_backend.data._M_elems[6];
          result_2.m_backend.data._M_elems[7] = degeneps.m_backend.data._M_elems[7];
          result_2.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
          result_2.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
          result_2.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
          result_2.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
          auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
          result_2.m_backend.exp = degeneps.m_backend.exp;
          result_2.m_backend.neg = degeneps.m_backend.neg;
          uVar9._4_4_ = degeneps.m_backend.prec_elem;
          uVar9._0_4_ = degeneps.m_backend.fpclass;
          result_2.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
          if (result_2.m_backend.data._M_elems[0] != 0 ||
              degeneps.m_backend.fpclass != cpp_dec_float_finite) {
            result_2.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
          }
          fVar14 = result_2.m_backend.fpclass;
          result_2.m_backend.data._M_elems._0_16_ = auVar11;
          result_2.m_backend._48_8_ = uVar9;
          if ((degeneps.m_backend.fpclass == cpp_dec_float_NaN || fVar14 == cpp_dec_float_NaN) ||
             (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_468,&result_2.m_backend), -1 < iVar13)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                      (&local_468,&local_428);
            uVar8 = result_1.m_backend._48_8_;
            if ((local_468.fpclass != cpp_dec_float_NaN) &&
               ((local_2d8.fpclass != cpp_dec_float_NaN &&
                (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_468,&local_2d8), uVar8 = result_1.m_backend._48_8_,
                iVar13 < 1)))) {
              result_2.m_backend.data._M_elems._32_5_ = SUB85(local_3c8,0);
              result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_3c8 >> 0x28);
              result_2.m_backend.data._M_elems[4] = (uint)local_3e8._16_8_;
              result_2.m_backend.data._M_elems[5] = SUB84(local_3e8._16_8_,4);
              result_2.m_backend.data._M_elems[6] = (uint)uStack_3d0;
              result_2.m_backend.data._M_elems[7] = (uint)((ulong)uStack_3d0 >> 0x20);
              result_2.m_backend.data._M_elems[2] = local_3e8[2];
              result_2.m_backend.data._M_elems[3] = local_3e8[3];
              result_2.m_backend.data._M_elems[0] = local_3e8[0];
              result_2.m_backend.data._M_elems[1] = local_3e8[1];
              result_2.m_backend.exp = local_478;
              result_2.m_backend.neg = local_4b9;
              result_2.m_backend.fpclass = local_378;
              result_2.m_backend.prec_elem = iStack_374;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_2.m_backend,&epsilon.m_backend);
              uVar8 = result_1.m_backend._48_8_;
              if ((local_468.fpclass != cpp_dec_float_NaN) &&
                 ((((result_2.m_backend.fpclass != cpp_dec_float_NaN &&
                    (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_468,&result_2.m_backend),
                    uVar8 = result_1.m_backend._48_8_, 0 < iVar13)) &&
                   (local_428.fpclass != cpp_dec_float_NaN)) &&
                  ((local_368.fpclass != cpp_dec_float_NaN &&
                   (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_428,&local_368), uVar8 = result_1.m_backend._48_8_,
                   0 < iVar13)))))) {
                local_3c8 = CONCAT35(local_468.data._M_elems[9]._1_3_,local_468.data._M_elems._32_5_
                                    );
                uStack_3d0 = CONCAT35(local_468.data._M_elems[7]._1_3_,
                                      local_468.data._M_elems._24_5_);
                local_368.neg = local_428.neg;
LAB_002ce178:
                uStack_370 = 0;
                local_4b9 = local_468.neg;
                local_478 = local_468.exp;
                local_474 = iVar12;
                local_3e8._0_8_ = local_468.data._M_elems._0_8_;
                local_3e8._8_8_ = local_468.data._M_elems._8_8_;
                local_3e8._16_8_ = local_468.data._M_elems._16_8_;
                _local_378 = local_468._48_8_;
                local_368.data._M_elems[0] = local_428.data._M_elems[0];
                local_368.data._M_elems[1] = local_428.data._M_elems[1];
                local_368.data._M_elems[2] = local_428.data._M_elems[2];
                local_368.data._M_elems[3] = local_428.data._M_elems[3];
                local_368.data._M_elems[4] = local_428.data._M_elems[4];
                local_368.data._M_elems[5] = local_428.data._M_elems[5];
                local_368.data._M_elems[6] = local_428.data._M_elems[6];
                local_368.data._M_elems[7] = local_428.data._M_elems[7];
                local_368.data._M_elems[8] = local_428.data._M_elems[8];
                local_368.data._M_elems[9] = local_428.data._M_elems[9];
                local_368.exp = local_428.exp;
                local_368._48_8_ = local_428._48_8_;
                uVar8 = result_1.m_backend._48_8_;
              }
            }
          }
          else {
            iVar13 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])(this);
            lVar6 = *plVar4;
            local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar6 + lVar19);
            local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar6 + lVar19) + 2);
            puVar2 = (uint *)(lVar6 + 0x10 + lVar19);
            local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar6 + 0x20 + lVar19);
            local_e8.m_backend.exp = *(int *)(lVar6 + 0x28 + lVar19);
            local_e8.m_backend.neg = *(bool *)(lVar6 + 0x2c + lVar19);
            local_e8.m_backend._48_8_ = *(undefined8 *)(lVar6 + 0x30 + lVar19);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftUBbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_06,iVar13),iVar12,&local_e8);
            uVar8 = result_1.m_backend._48_8_;
          }
        }
        result_1.m_backend._48_8_ = uVar8;
        lVar18 = lVar18 + -1;
      } while (1 < lVar18);
      goto LAB_002cee51;
    }
  }
  local_474 = -1;
LAB_002cee51:
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar12) + 0x368))(&result_2);
  if (((local_1e8.fpclass == cpp_dec_float_NaN) || (result_2.m_backend.fpclass == cpp_dec_float_NaN)
      ) || (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_1e8,&result_2.m_backend), iVar12 != 0)) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_68,0,(type *)0x0);
    local_474 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[7])(this,val,&local_68,0);
  }
  else {
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_3c8;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_3e8._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = uStack_3d0;
    *(undefined8 *)(val->m_backend).data._M_elems = local_3e8._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_3e8._8_8_;
    (val->m_backend).exp = local_478;
    (val->m_backend).neg = local_4b9;
    (val->m_backend).fpclass = local_378;
    (val->m_backend).prec_elem = iStack_374;
  }
  return local_474;
}

Assistant:

int SPxHarrisRT<R>::selectLeave(R& val, R, bool)
{
   int i, j;
   R stab, x, y;
   R max;
   R sel;
   R lastshift;
   R useeps;
   int leave = -1;
   R maxabs = 1;

   R epsilon  = this->solver()->epsilon();
   R degeneps = degenerateEps();

   SSVectorBase<R>& upd = this->solver()->fVec().delta();
   VectorBase<R>& vec = this->solver()->fVec();

   const VectorBase<R>& up = this->solver()->ubBound();
   const VectorBase<R>& low = this->solver()->lbBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   max = val;
   lastshift = this->solver()->shift();

   this->solver()->fVec().delta().setup();

   if(max > epsilon)
   {
      // phase 1:
      maxDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),         /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;


      // phase 2:
      stab = 0;
      sel = R(-infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x > useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else if(x < -useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }


   else if(max < -epsilon)
   {
      // phase 1:
      minDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),                 /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;

      // phase 2:
      stab = 0;
      sel = R(infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x < -useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]);   // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else if(x > useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }

   else
      return -1;


   if(lastshift != this->solver()->shift())
      return selectLeave(val, 0, false);

   assert(leave >= 0);

   val = sel;
   return leave;
}